

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
::deactivate(basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
             *this,timer_holder *timer)

{
  reference_counter_type *prVar1;
  lock_guard locker;
  timer_object_holder<timertt::thread_safety::safe> local_30;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  local_30.m_timer = timer->m_timer;
  if (local_30.m_timer != (timer_object<timertt::thread_safety::safe> *)0x0) {
    LOCK();
    ((local_30.m_timer)->m_references).super___atomic_base<unsigned_int>._M_i =
         ((local_30.m_timer)->m_references).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::deactivate(&this->m_engine,&local_30);
  if (local_30.m_timer != (timer_object<timertt::thread_safety::safe> *)0x0) {
    LOCK();
    prVar1 = &(local_30.m_timer)->m_references;
    (prVar1->super___atomic_base<unsigned_int>)._M_i =
         (prVar1->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if ((prVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
      (*(local_30.m_timer)->_vptr_timer_object[1])();
    }
    local_30.m_timer = (timer_object<timertt::thread_safety::safe> *)0x0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void
	deactivate(
		//! Timer to be deactivated.
		timer_holder timer )
	{
		typename mixin_type::lock_guard locker{ *this };

		m_engine.deactivate( timer );
	}